

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::PickPlayerClass(DPlayerMenu *this)

{
  uint uVar1;
  
  uVar1 = 0;
  if (1 < PlayerClasses.Count) {
    uVar1 = userinfo_t::GetPlayerClassNum
                      ((userinfo_t *)(&DAT_017dbfb8 + (long)consoleplayer * 0x2a0));
    if ((int)uVar1 < 0) {
      uVar1 = (uint)(DMenu::MenuTime >> 7) % PlayerClasses.Count;
    }
  }
  this->PlayerClassIndex = uVar1;
  this->PlayerClass = PlayerClasses.Array + (int)uVar1;
  UpdateTranslation(this);
  return;
}

Assistant:

void DPlayerMenu::PickPlayerClass()
{

	/*
	// What's the point of this? Aren't we supposed to edit the
	// userinfo?
	if (players[consoleplayer].mo != NULL)
	{
		PlayerClassIndex = players[consoleplayer].CurrentPlayerClass;
	}
	else
	*/
	{
		int pclass = 0;
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			pclass = players[consoleplayer].userinfo.GetPlayerClassNum();

			if (pclass < 0)
			{
				pclass = (MenuTime>>7) % PlayerClasses.Size ();
			}
		}
		PlayerClassIndex = pclass;
	}
	PlayerClass = &PlayerClasses[PlayerClassIndex];
	UpdateTranslation();
}